

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_MuxStructDump_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Str_t *vStr)

{
  int iVar1;
  undefined8 local_48;
  undefined8 local_38;
  Vec_Str_t *vStr_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if ((*(ulong *)pObj >> 0x1e & 1) != 0) {
    Vec_StrPush(vStr,'[');
    Vec_StrPush(vStr,'(');
    iVar1 = Gia_ObjFaninId2p(p,pObj);
    Vec_StrPrintNum(vStr,iVar1);
    Vec_StrPush(vStr,')');
    iVar1 = Gia_ObjFaninC2(p,pObj);
    if (iVar1 == 0) {
      local_38 = Gia_ObjFanin1(pObj);
    }
    else {
      local_38 = Gia_ObjFanin0(pObj);
    }
    Str_MuxStructDump_rec(p,local_38,vStr);
    Vec_StrPush(vStr,'|');
    iVar1 = Gia_ObjFaninC2(p,pObj);
    if (iVar1 == 0) {
      local_48 = Gia_ObjFanin0(pObj);
    }
    else {
      local_48 = Gia_ObjFanin1(pObj);
    }
    Str_MuxStructDump_rec(p,local_48,vStr);
    Vec_StrPush(vStr,']');
  }
  return;
}

Assistant:

void Str_MuxStructDump_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Str_t * vStr )
{
    if ( !pObj->fMark0 )
        return;
    Vec_StrPush( vStr, '[' );
    Vec_StrPush( vStr, '(' );
    Vec_StrPrintNum( vStr, Gia_ObjFaninId2p(p, pObj) );
    Vec_StrPush( vStr, ')' );
    Str_MuxStructDump_rec( p, Gia_ObjFaninC2(p, pObj) ? Gia_ObjFanin0(pObj) : Gia_ObjFanin1(pObj), vStr );
    Vec_StrPush( vStr, '|' );
    Str_MuxStructDump_rec( p, Gia_ObjFaninC2(p, pObj) ? Gia_ObjFanin1(pObj) : Gia_ObjFanin0(pObj), vStr );
    Vec_StrPush( vStr, ']' );
}